

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

int Abc_FlowRetime_PushFlows(Abc_Ntk_t *pNtk,int fVerbose)

{
  ushort uVar1;
  Abc_Obj_t *pObj;
  ushort uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  MinRegMan_t *pMVar7;
  ushort uVar8;
  ulong uVar9;
  long lVar10;
  
  pMVar7 = pManMR;
  pManMR->constraintMask = pManMR->constraintMask | 0x10;
  pMVar7->fSinkDistTerminate = 0;
  dfsfast_preorder(pNtk);
  uVar9 = 0;
  pMVar7 = pManMR;
  if (pManMR->fSinkDistTerminate == 0) {
    pVVar6 = pNtk->vBoxes;
    uVar9 = 0;
    while( true ) {
      iVar4 = pVVar6->nSize;
      if ((long)iVar4 < 1) break;
      uVar8 = 30000;
      lVar10 = 0;
      do {
        if ((*(uint *)((long)pVVar6->pArray[lVar10] + 0x14) & 0xf) == 8) {
          uVar1 = *(ushort *)
                   &pMVar7->pDataArray[*(uint *)((long)pVVar6->pArray[lVar10] + 0x10)].field_0x10;
          uVar2 = uVar1;
          if (uVar8 < uVar1) {
            uVar2 = uVar8;
          }
          if (uVar1 != 0) {
            uVar8 = uVar2;
          }
        }
        lVar10 = lVar10 + 1;
      } while (iVar4 != lVar10);
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar6->pArray[lVar10];
          if (((*(uint *)&pObj->field_0x14 & 0xf) == 8) &&
             (uVar8 == *(ushort *)&pManMR->pDataArray[(uint)pObj->Id].field_0x10)) {
            iVar4 = dfsfast_e(pObj,(Abc_Obj_t *)0x0);
            uVar9 = (ulong)(((int)uVar9 + 1) - (uint)(iVar4 == 0));
            pVVar6 = pNtk->vBoxes;
          }
          lVar10 = lVar10 + 1;
          pMVar7 = pManMR;
        } while (lVar10 < pVVar6->nSize);
      }
      if ((pMVar7->fSinkDistTerminate != 0) || (29999 < uVar8)) break;
    }
  }
  if ((fVerbose != 0) && (pMVar7->fVerbose != 0)) {
    printf("\t\tmax-flow1 = %d \t");
  }
  pVVar6 = pNtk->vBoxes;
  do {
    iVar4 = (int)uVar9;
    if (pVVar6->nSize < 1) break;
    lVar10 = 0;
    do {
      if (((*(uint *)&((Abc_Obj_t *)pVVar6->pArray[lVar10])->field_0x14 & 0xf) == 8) &&
         (iVar3 = dfsplain_e((Abc_Obj_t *)pVVar6->pArray[lVar10],(Abc_Obj_t *)0x0), iVar3 != 0)) {
        uVar9 = (ulong)((int)uVar9 + 1);
        pVVar6 = pNtk->vObjs;
        if (0 < pVVar6->nSize) {
          lVar5 = 0;
          do {
            if (pVVar6->pArray[lVar5] != (void *)0x0) {
              *(ushort *)(pManMR->pDataArray + *(uint *)((long)pVVar6->pArray[lVar5] + 0x10)) =
                   *(ushort *)(pManMR->pDataArray + *(uint *)((long)pVVar6->pArray[lVar5] + 0x10)) &
                   0xfffc;
              pVVar6 = pNtk->vObjs;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < pVVar6->nSize);
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar10 < pVVar6->nSize);
  } while (iVar4 < (int)uVar9);
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("max-flow2 = %d\n",uVar9);
  }
  return (int)uVar9;
}

Assistant:

int
Abc_FlowRetime_PushFlows( Abc_Ntk_t * pNtk, int fVerbose ) {
  int i, j, flow = 0, last, srcDist = 0;
  Abc_Obj_t   *pObj, *pObj2;
//  int clk = clock();

  pManMR->constraintMask |= BLOCK;

  pManMR->fSinkDistTerminate = 0;
  dfsfast_preorder( pNtk );

  // (i) fast max-flow computation
  while(!pManMR->fSinkDistTerminate && srcDist < MAX_DIST) {
    srcDist = MAX_DIST;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      if (FDATA(pObj)->e_dist)    
        srcDist = MIN(srcDist, (int)FDATA(pObj)->e_dist);
    
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (srcDist == (int)FDATA(pObj)->e_dist &&
          dfsfast_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
      }
    }
  }

  if (fVerbose) vprintf("\t\tmax-flow1 = %d \t", flow);

  // (ii) complete max-flow computation
  // also, marks source-reachable nodes
  do {
    last = flow;
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (dfsplain_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
        Abc_NtkForEachObj( pNtk, pObj2, j )
          FUNSET( pObj2, VISITED );
      }
    }
  } while (flow > last);
  
  if (fVerbose) vprintf("max-flow2 = %d\n", flow);

//  PRT( "time", clock() - clk );
  return flow;
}